

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O1

int Gia_MiniAigSuperMerge(Vec_Int_t *p,int nPis)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  
  uVar4 = p->nSize;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    iVar3 = -1;
    uVar7 = 0;
    iVar2 = 0;
  }
  else {
    piVar1 = p->pArray;
    lVar8 = 0;
    iVar2 = 0;
    uVar7 = 0;
    iVar6 = -1;
    do {
      iVar3 = piVar1[lVar8];
      if (iVar6 == iVar3) {
        if (((int)uVar7 < 0) || ((int)uVar5 <= (int)uVar7)) goto LAB_00781249;
        iVar6 = (iVar3 / nPis + 1) * nPis + iVar3 % nPis;
        iVar2 = 1;
        iVar3 = -1;
LAB_007811fc:
        uVar5 = (ulong)uVar7;
        uVar7 = uVar7 + 1;
        piVar1[uVar5] = iVar6;
      }
      else if (iVar6 != -1) {
        if ((-1 < (int)uVar7) && ((int)uVar7 < (int)uVar5)) goto LAB_007811fc;
        goto LAB_00781249;
      }
      lVar8 = lVar8 + 1;
      uVar4 = p->nSize;
      uVar5 = (ulong)(int)uVar4;
      iVar6 = iVar3;
    } while (lVar8 < (long)uVar5);
  }
  if (iVar3 != -1) {
    if (((int)uVar7 < 0) || ((int)uVar4 <= (int)uVar7)) {
LAB_00781249:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    uVar5 = (ulong)uVar7;
    uVar7 = uVar7 + 1;
    p->pArray[uVar5] = iVar3;
  }
  if (p->nSize < (int)uVar7) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  p->nSize = uVar7;
  return iVar2;
}

Assistant:

int Gia_MiniAigSuperMerge( Vec_Int_t * p, int nPis )
{
    int i, k = 0, This, Prev = -1, fChange = 0;
    Vec_IntForEachEntry( p, This, i )
    {
        if ( Prev == This )
        {
            Vec_IntWriteEntry( p, k++, (This/nPis+1)*nPis + This%nPis );
            Prev = -1;
            fChange = 1;
        }
        else 
        {
            if ( Prev != -1 ) 
                Vec_IntWriteEntry( p, k++, Prev );
            Prev = This;
        }
    }
    if ( Prev != -1 )
        Vec_IntWriteEntry( p, k++, Prev );
    Vec_IntShrink( p, k );
    return fChange;
}